

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O0

_Bool upb_DefPool_SetFeatureSetDefaults
                (upb_DefPool *s,char *serialized_defaults,size_t serialized_len,upb_Status *status)

{
  google_protobuf_FeatureSetDefaults *pgVar1;
  int32_t edition_00;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  google_protobuf_FeatureSetDefaults_FeatureSetEditionDefault **ppgVar5;
  google_protobuf_FeatureSetDefaults_FeatureSetEditionDefault **ppgStack_60;
  int edition;
  size_t i;
  int prev_edition;
  google_protobuf_FeatureSetDefaults_FeatureSetEditionDefault **default_list;
  size_t size;
  int max_edition;
  int min_edition;
  google_protobuf_FeatureSetDefaults *defaults;
  upb_Status *status_local;
  size_t serialized_len_local;
  char *serialized_defaults_local;
  upb_DefPool *s_local;
  
  defaults = (google_protobuf_FeatureSetDefaults *)status;
  status_local = (upb_Status *)serialized_len;
  serialized_len_local = (size_t)serialized_defaults;
  serialized_defaults_local = (char *)s;
  _max_edition = google_protobuf_FeatureSetDefaults_parse
                           (serialized_defaults,serialized_len,s->arena);
  if (_max_edition == (google_protobuf_FeatureSetDefaults *)0x0) {
    upb_Status_SetErrorFormat((upb_Status *)defaults,"Failed to parse defaults");
    s_local._7_1_ = false;
  }
  else {
    sVar2 = upb_strtable_count((upb_strtable *)(serialized_defaults_local + 0x28));
    if (sVar2 == 0) {
      size._4_4_ = google_protobuf_FeatureSetDefaults_minimum_edition(_max_edition);
      size._0_4_ = google_protobuf_FeatureSetDefaults_maximum_edition(_max_edition);
      pgVar1 = defaults;
      if ((int32_t)size < size._4_4_) {
        pcVar3 = upb_FileDef_EditionName(size._4_4_);
        pcVar4 = upb_FileDef_EditionName((int32_t)size);
        upb_Status_SetErrorFormat
                  ((upb_Status *)pgVar1,"Invalid edition range %s to %s",pcVar3,pcVar4);
        s_local._7_1_ = false;
      }
      else {
        ppgVar5 = google_protobuf_FeatureSetDefaults_defaults(_max_edition,(size_t *)&default_list);
        i._4_4_ = 0;
        for (ppgStack_60 = (google_protobuf_FeatureSetDefaults_FeatureSetEditionDefault **)0x0;
            ppgStack_60 < default_list;
            ppgStack_60 = (google_protobuf_FeatureSetDefaults_FeatureSetEditionDefault **)
                          ((long)ppgStack_60 + 1)) {
          edition_00 = google_protobuf_FeatureSetDefaults_FeatureSetEditionDefault_edition
                                 (ppgVar5[(long)ppgStack_60]);
          pgVar1 = defaults;
          if (edition_00 == 0) {
            upb_Status_SetErrorFormat((upb_Status *)defaults,"Invalid edition UNKNOWN specified");
            return false;
          }
          if (edition_00 <= i._4_4_) {
            pcVar3 = upb_FileDef_EditionName(i._4_4_);
            pcVar4 = upb_FileDef_EditionName(edition_00);
            upb_Status_SetErrorFormat
                      ((upb_Status *)pgVar1,
                       "Feature set defaults are not strictly increasing, %s is greater than or equal to %s"
                       ,pcVar3,pcVar4);
            return false;
          }
          i._4_4_ = edition_00;
        }
        *(google_protobuf_FeatureSetDefaults **)(serialized_defaults_local + 0x88) = _max_edition;
        s_local._7_1_ = true;
      }
    }
    else {
      upb_Status_SetErrorFormat
                ((upb_Status *)defaults,
                 "Feature set defaults can\'t be changed once the pool has started building");
      s_local._7_1_ = false;
    }
  }
  return s_local._7_1_;
}

Assistant:

bool upb_DefPool_SetFeatureSetDefaults(upb_DefPool* s,
                                       const char* serialized_defaults,
                                       size_t serialized_len,
                                       upb_Status* status) {
  const UPB_DESC(FeatureSetDefaults)* defaults = UPB_DESC(
      FeatureSetDefaults_parse)(serialized_defaults, serialized_len, s->arena);
  if (!defaults) {
    upb_Status_SetErrorFormat(status, "Failed to parse defaults");
    return false;
  }
  if (upb_strtable_count(&s->files) > 0) {
    upb_Status_SetErrorFormat(status,
                              "Feature set defaults can't be changed once the "
                              "pool has started building");
    return false;
  }
  int min_edition = UPB_DESC(FeatureSetDefaults_minimum_edition(defaults));
  int max_edition = UPB_DESC(FeatureSetDefaults_maximum_edition(defaults));
  if (min_edition > max_edition) {
    upb_Status_SetErrorFormat(status, "Invalid edition range %s to %s",
                              upb_FileDef_EditionName(min_edition),
                              upb_FileDef_EditionName(max_edition));
    return false;
  }
  size_t size;
  const UPB_DESC(
      FeatureSetDefaults_FeatureSetEditionDefault)* const* default_list =
      UPB_DESC(FeatureSetDefaults_defaults(defaults, &size));
  int prev_edition = UPB_DESC(EDITION_UNKNOWN);
  for (size_t i = 0; i < size; ++i) {
    int edition = UPB_DESC(
        FeatureSetDefaults_FeatureSetEditionDefault_edition(default_list[i]));
    if (edition == UPB_DESC(EDITION_UNKNOWN)) {
      upb_Status_SetErrorFormat(status, "Invalid edition UNKNOWN specified");
      return false;
    }
    if (edition <= prev_edition) {
      upb_Status_SetErrorFormat(status,
                                "Feature set defaults are not strictly "
                                "increasing, %s is greater than or equal to %s",
                                upb_FileDef_EditionName(prev_edition),
                                upb_FileDef_EditionName(edition));
      return false;
    }
    prev_edition = edition;
  }

  // Copy the defaults into the pool.
  s->feature_set_defaults = defaults;
  return true;
}